

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * util::uppercase(string *__return_storage_ptr__,string *subject)

{
  size_type sVar1;
  pointer pcVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)subject->_M_string_length);
  sVar1 = subject->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (subject->_M_dataplus)._M_p;
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar4 = toupper((int)pcVar2[sVar5]);
      pcVar3[sVar5] = (char)iVar4;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string uppercase(const std::string& subject)
{
	std::string result;
	result.resize(subject.length());

	std::transform(subject.begin(), subject.end(), result.begin(), static_cast<int(*)(int)>(std::toupper));

	return result;
}